

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_response.c
# Opt level: O0

void nhr_response_add_body_data(nhr_response r,void *data,size_t data_size)

{
  ulong new_size;
  void *pvVar1;
  char *body;
  size_t required;
  size_t data_size_local;
  void *data_local;
  nhr_response r_local;
  
  new_size = r->body_len + data_size;
  if (r->body_size < new_size) {
    pvVar1 = nhr_realloc(r->body,new_size);
    r->body = pvVar1;
    r->body_size = new_size;
  }
  memcpy((void *)(r->body_len + (long)r->body),data,data_size);
  r->body_len = data_size + r->body_len;
  nhr_response_fix_body_len(r);
  return;
}

Assistant:

void nhr_response_add_body_data(nhr_response r, void * data, const size_t data_size) {
	const size_t required = r->body_len + data_size;
	char * body = NULL;

	if (required > r->body_size) {
		r->body = nhr_realloc(r->body, required);
		r->body_size = required;
	}

	body = (char *)r->body;
	body += r->body_len;
	memcpy(body, data, data_size);
	r->body_len += data_size;
	nhr_response_fix_body_len(r);
}